

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-birth.c
# Opt level: O3

void player_generate(player *p,player_race *r,player_class *c,_Bool old_history)

{
  int32_t iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  level_map_conflict *map;
  uint uVar10;
  char *pcVar11;
  char *pcVar12;
  level_conflict *plVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  short sVar17;
  short sVar19;
  undefined1 auVar18 [16];
  short sVar20;
  short sVar21;
  short sVar22;
  short sVar23;
  short sVar24;
  short sVar25;
  short sVar26;
  short sVar27;
  int iVar28;
  int iVar30;
  int iVar31;
  undefined1 auVar29 [16];
  int iVar32;
  undefined1 in_XMM4 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  int iVar49;
  int iVar51;
  undefined1 auVar50 [16];
  undefined1 in_XMM15 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  
  if (c == (player_class *)0x0) {
    c = p->class;
  }
  if (r == (player_race *)0x0) {
    r = p->race;
  }
  p->class = c;
  p->race = r;
  map = world;
  if (world == (level_map_conflict *)0x0) {
    p->exp = 0;
    p->max_lev = 1;
    p->lev = 1;
    p->max_exp = 0;
    goto LAB_001b385e;
  }
  lVar16 = (long)r->start_lev;
  pcVar12 = world->name;
  if (lVar16 == 1) {
LAB_001b37d8:
    p->max_exp = 0;
    p->exp = 0;
    lVar16 = 1;
  }
  else {
    pcVar11 = strstr(pcVar12,"Dungeon");
    if ((pcVar11 != (char *)0x0) || ((player->opts).opt[0x2b] != false)) goto LAB_001b37d8;
    iVar1 = *(int32_t *)("You have discovered a trap on the chest!" + lVar16 * 4 + 0x25);
    p->exp = iVar1;
    p->max_exp = iVar1;
  }
  p->lev = (int16_t)lVar16;
  p->max_lev = (int16_t)lVar16;
  pcVar12 = strstr(pcVar12,"Dungeon");
  if (pcVar12 == (char *)0x0) {
    if ((player->opts).opt[0x2b] == true) {
      p->home = 0;
    }
    else {
      plVar13 = level_by_name(map,r->hometown);
      p->home = (int16_t)plVar13->index;
    }
  }
  else {
    p->home = 1;
    pcVar12 = option_name(0x2b);
    option_set(pcVar12,0);
  }
LAB_001b385e:
  uVar14 = p->class->c_mhp + p->race->r_mhp;
  p->hitdie = (uint8_t)uVar14;
  uVar14 = uVar14 & 0xff;
  p->player_hp[0] = (int16_t)uVar14;
  auVar9 = _DAT_0022f180;
  auVar8 = _DAT_002256f0;
  auVar7 = _DAT_00224950;
  auVar6 = _DAT_00224940;
  uVar10 = (uint)p->lev;
  if (1 < (int)uVar10) {
    lVar16 = (ulong)uVar10 - 2;
    auVar18 = pshuflw(ZEXT416(uVar14),ZEXT416(uVar14),0);
    auVar35._0_4_ = auVar18._0_4_;
    auVar35._4_4_ = auVar35._0_4_;
    auVar35._8_4_ = auVar35._0_4_;
    auVar35._12_4_ = auVar35._0_4_;
    sVar17 = auVar18._0_2_;
    sVar19 = auVar18._2_2_;
    sVar21 = sVar19 * 2;
    sVar22 = sVar17 * 3;
    sVar23 = sVar19 * 4;
    sVar24 = sVar17 * 5;
    sVar25 = sVar19 * 6;
    sVar26 = sVar17 * 7;
    sVar27 = sVar19 * 8;
    auVar18 = psllw(auVar35,3);
    auVar29._8_4_ = (int)lVar16;
    auVar29._0_8_ = lVar16;
    auVar29._12_4_ = (int)((ulong)lVar16 >> 0x20);
    uVar15 = 0;
    auVar29 = auVar29 ^ _DAT_00224950;
    sVar20 = sVar17;
    do {
      auVar36._8_4_ = (int)uVar15;
      auVar36._0_8_ = uVar15;
      auVar36._12_4_ = (int)(uVar15 >> 0x20);
      auVar35 = (auVar36 | auVar6) ^ auVar7;
      iVar28 = auVar29._0_4_;
      iVar49 = -(uint)(iVar28 < auVar35._0_4_);
      iVar30 = auVar29._4_4_;
      auVar38._4_4_ = -(uint)(iVar30 < auVar35._4_4_);
      iVar31 = auVar29._8_4_;
      iVar51 = -(uint)(iVar31 < auVar35._8_4_);
      iVar32 = auVar29._12_4_;
      auVar38._12_4_ = -(uint)(iVar32 < auVar35._12_4_);
      auVar44._4_4_ = iVar49;
      auVar44._0_4_ = iVar49;
      auVar44._8_4_ = iVar51;
      auVar44._12_4_ = iVar51;
      auVar52 = pshuflw(in_XMM15,auVar44,0xe8);
      auVar53._0_4_ = -(uint)(auVar35._0_4_ == iVar28);
      auVar53._4_4_ = -(uint)(auVar35._4_4_ == iVar30);
      auVar53._8_4_ = -(uint)(auVar35._8_4_ == iVar31);
      auVar53._12_4_ = -(uint)(auVar35._12_4_ == iVar32);
      auVar46._4_4_ = auVar53._4_4_;
      auVar46._0_4_ = auVar53._4_4_;
      auVar46._8_4_ = auVar53._12_4_;
      auVar46._12_4_ = auVar53._12_4_;
      auVar35 = pshuflw(auVar53,auVar46,0xe8);
      auVar38._0_4_ = auVar38._4_4_;
      auVar38._8_4_ = auVar38._12_4_;
      auVar53 = pshuflw(auVar52,auVar38,0xe8);
      auVar54._8_4_ = 0xffffffff;
      auVar54._0_8_ = 0xffffffffffffffff;
      auVar54._12_4_ = 0xffffffff;
      auVar54 = (auVar53 | auVar35 & auVar52) ^ auVar54;
      auVar35 = packssdw(auVar54,auVar54);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 1] = sVar20 + sVar17;
      }
      auVar38 = auVar46 & auVar44 | auVar38;
      auVar35 = packssdw(auVar38,auVar38);
      auVar52._8_4_ = 0xffffffff;
      auVar52._0_8_ = 0xffffffffffffffff;
      auVar52._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar52,auVar35 ^ auVar52);
      if ((auVar35._0_4_ >> 0x10 & 1) != 0) {
        p->player_hp[uVar15 + 2] = sVar21 + sVar19;
      }
      auVar35 = (auVar36 | auVar8) ^ auVar7;
      iVar49 = -(uint)(iVar28 < auVar35._0_4_);
      auVar50._4_4_ = -(uint)(iVar30 < auVar35._4_4_);
      iVar51 = -(uint)(iVar31 < auVar35._8_4_);
      auVar50._12_4_ = -(uint)(iVar32 < auVar35._12_4_);
      auVar39._4_4_ = iVar49;
      auVar39._0_4_ = iVar49;
      auVar39._8_4_ = iVar51;
      auVar39._12_4_ = iVar51;
      auVar45._4_4_ = -(uint)(auVar35._4_4_ == iVar30);
      auVar45._12_4_ = -(uint)(auVar35._12_4_ == iVar32);
      auVar45._0_4_ = auVar45._4_4_;
      auVar45._8_4_ = auVar45._12_4_;
      auVar50._0_4_ = auVar50._4_4_;
      auVar50._8_4_ = auVar50._12_4_;
      auVar35 = auVar45 & auVar39 | auVar50;
      auVar35 = packssdw(auVar35,auVar35);
      auVar2._8_4_ = 0xffffffff;
      auVar2._0_8_ = 0xffffffffffffffff;
      auVar2._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar2,auVar35 ^ auVar2);
      if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 3] = sVar22 + sVar17;
      }
      auVar54 = pshufhw(auVar39,auVar39,0x84);
      auVar46 = pshufhw(auVar45,auVar45,0x84);
      auVar53 = pshufhw(auVar54,auVar50,0x84);
      auVar40._8_4_ = 0xffffffff;
      auVar40._0_8_ = 0xffffffffffffffff;
      auVar40._12_4_ = 0xffffffff;
      auVar40 = (auVar53 | auVar46 & auVar54) ^ auVar40;
      auVar54 = packssdw(auVar40,auVar40);
      if ((auVar54 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 4] = sVar23 + sVar19;
      }
      auVar54 = (auVar36 | auVar9) ^ auVar7;
      iVar49 = -(uint)(iVar28 < auVar54._0_4_);
      auVar42._4_4_ = -(uint)(iVar30 < auVar54._4_4_);
      iVar51 = -(uint)(iVar31 < auVar54._8_4_);
      auVar42._12_4_ = -(uint)(iVar32 < auVar54._12_4_);
      auVar47._4_4_ = iVar49;
      auVar47._0_4_ = iVar49;
      auVar47._8_4_ = iVar51;
      auVar47._12_4_ = iVar51;
      auVar53 = pshuflw(auVar35,auVar47,0xe8);
      auVar41._4_4_ = -(uint)(auVar54._4_4_ == iVar30);
      auVar41._12_4_ = -(uint)(auVar54._12_4_ == iVar32);
      auVar41._0_4_ = auVar41._4_4_;
      auVar41._8_4_ = auVar41._12_4_;
      auVar35 = pshuflw(in_XMM4,auVar41,0xe8);
      auVar42._0_4_ = auVar42._4_4_;
      auVar42._8_4_ = auVar42._12_4_;
      auVar54 = pshuflw(auVar53,auVar42,0xe8);
      auVar3._8_4_ = 0xffffffff;
      auVar3._0_8_ = 0xffffffffffffffff;
      auVar3._12_4_ = 0xffffffff;
      in_XMM15 = (auVar54 | auVar35 & auVar53) ^ auVar3;
      auVar35 = packssdw(auVar35 & auVar53,in_XMM15);
      if ((auVar35 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 5] = sVar24 + sVar17;
      }
      auVar42 = auVar41 & auVar47 | auVar42;
      auVar54 = packssdw(auVar42,auVar42);
      auVar4._8_4_ = 0xffffffff;
      auVar4._0_8_ = 0xffffffffffffffff;
      auVar4._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35,auVar54 ^ auVar4);
      if ((auVar35 & (undefined1  [16])0x10000) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 6] = sVar25 + sVar19;
      }
      auVar35 = (auVar36 | _DAT_0022f170) ^ auVar7;
      auVar33._0_4_ = -(uint)(iVar28 < auVar35._0_4_);
      auVar33._4_4_ = -(uint)(iVar30 < auVar35._4_4_);
      auVar33._8_4_ = -(uint)(iVar31 < auVar35._8_4_);
      auVar33._12_4_ = -(uint)(iVar32 < auVar35._12_4_);
      auVar43._4_4_ = auVar33._0_4_;
      auVar43._0_4_ = auVar33._0_4_;
      auVar43._8_4_ = auVar33._8_4_;
      auVar43._12_4_ = auVar33._8_4_;
      auVar37._4_4_ = -(uint)(auVar35._4_4_ == iVar30);
      auVar37._12_4_ = -(uint)(auVar35._12_4_ == iVar32);
      auVar37._0_4_ = auVar37._4_4_;
      auVar37._8_4_ = auVar37._12_4_;
      auVar48._4_4_ = auVar33._4_4_;
      auVar48._0_4_ = auVar33._4_4_;
      auVar48._8_4_ = auVar33._12_4_;
      auVar48._12_4_ = auVar33._12_4_;
      auVar35 = packssdw(auVar33,auVar37 & auVar43 | auVar48);
      auVar5._8_4_ = 0xffffffff;
      auVar5._0_8_ = 0xffffffffffffffff;
      auVar5._12_4_ = 0xffffffff;
      auVar35 = packssdw(auVar35 ^ auVar5,auVar35 ^ auVar5);
      if ((auVar35 & (undefined1  [16])0x100000000) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 7] = sVar26 + sVar17;
      }
      auVar35 = pshufhw(auVar35,auVar43,0x84);
      auVar53 = pshufhw(auVar37,auVar37,0x84);
      auVar54 = pshufhw(auVar35,auVar48,0x84);
      auVar34._8_4_ = 0xffffffff;
      auVar34._0_8_ = 0xffffffffffffffff;
      auVar34._12_4_ = 0xffffffff;
      auVar34 = (auVar54 | auVar53 & auVar35) ^ auVar34;
      in_XMM4 = packssdw(auVar34,auVar34);
      if ((in_XMM4 & (undefined1  [16])0x1000000000000) != (undefined1  [16])0x0) {
        p->player_hp[uVar15 + 8] = sVar27 + sVar19;
      }
      uVar15 = uVar15 + 8;
      sVar20 = sVar20 + auVar18._0_2_;
      sVar21 = sVar21 + auVar18._2_2_;
      sVar22 = sVar22 + auVar18._4_2_;
      sVar23 = sVar23 + auVar18._6_2_;
      sVar24 = sVar24 + auVar18._8_2_;
      sVar25 = sVar25 + auVar18._10_2_;
      sVar26 = sVar26 + auVar18._12_2_;
      sVar27 = sVar27 + auVar18._14_2_;
    } while ((uVar10 + 6 & 0xfff8) != uVar15);
  }
  p->mhp = p->player_hp[(long)(int)uVar10 + -1];
  get_ahw(p);
  p->timed[10] = (short)PY_FOOD_FULL + -1;
  if (!old_history) {
    if (p->history != (char *)0x0) {
      string_free(p->history);
    }
    pcVar12 = get_history(p->race->history);
    p->history = pcVar12;
  }
  return;
}

Assistant:

void player_generate(struct player *p, const struct player_race *r,
					 const struct player_class *c, bool old_history)
{
	int i;

	if (!c)
		c = p->class;
	if (!r)
		r = p->race;

	p->class = c;
	p->race = r;

	/* Set the level */
	get_level(p);

	/* Hitdice */
	p->hitdie = p->race->r_mhp + p->class->c_mhp;

	/* Pre-calculate level 1 hitdice */
	p->player_hp[0] = p->hitdie;

	/*
	 * Fill in overestimates of hitpoints for additional levels.  Do not
	 * do the actual rolls so the player can not reset the birth screen
	 * to get a desirable set of initial rolls.
	 */
	for (i = 1; i < p->lev; i++) {
		p->player_hp[i] = p->player_hp[i - 1] + p->hitdie;
	}

	/* Initial hitpoints */
	p->mhp = p->player_hp[p->lev - 1];

	/* Roll for age/height/weight */
	get_ahw(p);

	/* Always start with a well fed player */
	p->timed[TMD_FOOD] = PY_FOOD_FULL - 1;

	if (!old_history) {
		if (p->history) {
			string_free(p->history);
		}
		p->history = get_history(p->race->history);
	}
}